

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdlogger.cpp
# Opt level: O1

void __thiscall CfdLogger_WriteLog_Test::TestBody(CfdLogger_WriteLog_Test *this)

{
  bool bVar1;
  CfdSourceLocation loc;
  AssertHelper local_50;
  string local_48;
  CfdSourceLocation local_28;
  
  local_28.funcname = "";
  local_28.filename = "";
  local_28.line = 0;
  local_28._12_4_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
      cfd::core::logger::WriteLog(&local_28,kCfdLogLevelInfo,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_cfdlogger.cpp"
               ,0x16,
               "Expected: (WriteLog(loc, CfdLogLevel::kCfdLogLevelInfo, \"\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((((long *)local_48._M_dataplus._M_p != (long *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((long *)local_48._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  return;
}

Assistant:

TEST(CfdLogger, WriteLog) {
  CfdSourceLocation loc {"", 0, ""};
  EXPECT_NO_THROW((WriteLog(loc, CfdLogLevel::kCfdLogLevelInfo, "")));
}